

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

bool str_cmp(char *astr,char *bstr)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  bVar2 = true;
  if (bstr != (char *)0x0 && astr != (char *)0x0) {
    lVar3 = 0;
    while( true ) {
      cVar1 = astr[lVar3];
      if ((cVar1 == '\0') && (bstr[lVar3] == '\0')) break;
      iVar4 = cVar1 + 0x20;
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        iVar4 = (int)cVar1;
      }
      cVar1 = bstr[lVar3];
      iVar5 = cVar1 + 0x20;
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        iVar5 = (int)cVar1;
      }
      if (iVar4 != iVar5) {
        return true;
      }
      lVar3 = lVar3 + 1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool str_cmp(const char *astr, const char *bstr)
{
	if (astr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null astr, bstr: {} ({}:{} dev=pimp)",gLastFile, gLastLine, bstr);
		return true;
	}

	if (bstr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null bstr, astr: {}", astr);
		return true;
	}

	for (; *astr || *bstr; astr++, bstr++)
	{
		if (LOWER(*astr) != LOWER(*bstr))
			return true;
	}

	return false;
}